

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_impl.hpp
# Opt level: O3

void __thiscall
websocketpp::connection<websocketpp::config::asio>::send_http_request
          (connection<websocketpp::config::asio> *this)

{
  header_list *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Base_ptr p_Var3;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_01;
  timer_handler *callback;
  char *buf;
  size_t len;
  undefined1 auVar4 [16];
  undefined1 auVar5 [8];
  int iVar6;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  const_iterator cVar8;
  mapped_type *pmVar9;
  undefined8 *puVar10;
  size_t in_RCX;
  _Base_ptr __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar11;
  undefined1 local_c8 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  undefined1 local_b8 [32];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_98;
  undefined1 auStack_90 [8];
  _Any_data local_88;
  code *pcStack_78;
  code *pcStack_70;
  undefined1 local_68 [32];
  _Alloc_hider _Stack_48;
  code *pcStack_40;
  
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            ((this->m_alog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0x400,"connection send_http_request",in_RCX);
  peVar1 = (this->m_processor).
           super___shared_ptr<websocketpp::processor::processor<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    auVar4._12_4_ = 0;
    auVar4._0_12_ = stack0xffffffffffffff3c;
    _local_c8 = (__weak_ptr<websocketpp::transport::asio::basic_socket::connection,_(__gnu_cxx::_Lock_policy)2>
                 )(auVar4 << 0x20);
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::_V2::system_category();
    _Stack_c0._M_pi = _Var7._M_pi;
    local_98._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (this->m_uri).super___shared_ptr<websocketpp::uri,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auStack_90 = (undefined1  [8])
                 (this->m_uri).super___shared_ptr<websocketpp::uri,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    p_Var2 = (this->m_uri).super___shared_ptr<websocketpp::uri,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    iVar6 = (*peVar1->_vptr_processor[8])
                      (peVar1,&this->m_request,&local_98,&this->m_requested_subprotocols);
    local_c8._0_4_ = iVar6;
    _Stack_c0._M_pi = extraout_RDX;
    if (auStack_90 != (undefined1  [8])0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_90);
    }
    if (iVar6 == 0) {
      local_c8 = (undefined1  [8])local_b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"User-Agent","");
      this_00 = &(this->m_request).super_parser.m_headers;
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_websocketpp::utility::ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&this_00->_M_t,(key_type *)local_c8);
      __n = (_Base_ptr)&http::empty_header_abi_cxx11_;
      if ((_Rb_tree_header *)cVar8._M_node !=
          &(this->m_request).super_parser.m_headers._M_t._M_impl.super__Rb_tree_header) {
        __n = cVar8._M_node + 2;
      }
      p_Var3 = __n->_M_parent;
      if (local_c8 != (undefined1  [8])local_b8) {
        operator_delete((void *)local_c8);
      }
      if (p_Var3 == (_Base_ptr)0x0) {
        if ((this->m_user_agent)._M_string_length == 0) {
          local_c8 = (undefined1  [8])local_b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"User-Agent","");
          pVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_websocketpp::utility::ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::equal_range(&this_00->_M_t,(key_type *)local_c8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_websocketpp::utility::ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar11.first._M_node,
                         (_Base_ptr)pVar11.second._M_node);
        }
        else {
          local_c8 = (undefined1  [8])local_b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"User-Agent","");
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_websocketpp::utility::ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](this_00,(key_type *)local_c8);
          std::__cxx11::string::_M_assign((string *)pmVar9);
        }
        if (local_c8 != (undefined1  [8])local_b8) {
          operator_delete((void *)local_c8);
        }
      }
      http::parser::request::raw_abi_cxx11_((string *)local_c8,&this->m_request);
      std::__cxx11::string::operator=((string *)&this->m_handshake_buffer,(string *)local_c8);
      if (local_c8 != (undefined1  [8])local_b8) {
        operator_delete((void *)local_c8);
      }
      this_01 = (this->m_alog).
                super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      if ((this_01->m_static_channels & 0x400) != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ,"Raw Handshake request:\n",&this->m_handshake_buffer);
        log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
                  (this_01,0x400,local_c8,(size_t)__n);
        if (local_c8 != (undefined1  [8])local_b8) {
          operator_delete((void *)local_c8);
        }
      }
      callback = (timer_handler *)this->m_open_handshake_timeout_dur;
      if (0 < (long)callback) {
        get_shared((connection<websocketpp::config::asio> *)local_68);
        local_b8._16_8_ = local_68._0_8_;
        local_b8._24_8_ = local_68._8_8_;
        local_68._0_16_ = ZEXT816(0) << 0x20;
        register0x00001200 = ZEXT832(0) << 0x20;
        puVar10 = (undefined8 *)operator_new(0x20);
        *puVar10 = handle_open_handshake_timeout;
        puVar10[1] = 0;
        local_68._16_8_ = puVar10;
        _Stack_48._M_p =
             (pointer)std::
                      _Function_handler<void_(const_std::error_code_&),_std::_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>_>
                      ::_M_manager;
        pcStack_40 = std::
                     _Function_handler<void_(const_std::error_code_&),_std::_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>_>
                     ::_M_invoke;
        puVar10[2] = local_b8._16_8_;
        puVar10[3] = local_b8._24_8_;
        transport::asio::connection<websocketpp::config::asio::transport_config>::set_timer
                  ((connection<websocketpp::config::asio::transport_config> *)local_c8,(long)this,
                   callback);
        auVar5 = local_c8;
        _Var7._M_pi = _Stack_c0._M_pi;
        _local_c8 = (__weak_ptr<websocketpp::transport::asio::basic_socket::connection,_(__gnu_cxx::_Lock_policy)2>
                     )ZEXT816(0);
        p_Var2 = (this->m_handshake_timer).
                 super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        (this->m_handshake_timer).
        super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)auVar5;
        (this->m_handshake_timer).
        super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = _Var7._M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
          }
        }
        if ((code *)_Stack_48._M_p != (code *)0x0) {
          (*(code *)_Stack_48._M_p)(local_68 + 0x10,local_68 + 0x10,3);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
        }
      }
      buf = (this->m_handshake_buffer)._M_dataplus._M_p;
      len = (this->m_handshake_buffer)._M_string_length;
      get_shared((connection<websocketpp::config::asio> *)local_c8);
      local_b8._16_8_ = local_c8;
      local_b8._24_8_ = _Stack_c0._M_pi;
      _local_c8 = (__weak_ptr<websocketpp::transport::asio::basic_socket::connection,_(__gnu_cxx::_Lock_policy)2>
                   )(ZEXT816(0) << 0x20);
      _local_88 = ZEXT832(0) << 0x20;
      puVar10 = (undefined8 *)operator_new(0x20);
      *puVar10 = handle_send_http_request;
      puVar10[1] = 0;
      local_88._M_unused._M_object = puVar10;
      pcStack_78 = std::
                   _Function_handler<void_(const_std::error_code_&),_std::_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>_>
                   ::_M_manager;
      pcStack_70 = std::
                   _Function_handler<void_(const_std::error_code_&),_std::_Bind<void_(websocketpp::connection<websocketpp::config::asio>::*(std::shared_ptr<websocketpp::connection<websocketpp::config::asio>_>,_std::_Placeholder<1>))(const_std::error_code_&)>_>
                   ::_M_invoke;
      puVar10[2] = local_b8._16_8_;
      puVar10[3] = local_b8._24_8_;
      transport::asio::connection<websocketpp::config::asio::transport_config>::async_write
                (&this->super_transport_con_type,buf,len,(write_handler *)&local_88);
      if (pcStack_78 != (_Invoker_type)0x0) {
        (*pcStack_78)(&local_88,&local_88,__destroy_functor);
      }
      if (_Stack_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_c0._M_pi);
      }
    }
    else {
      log_err<std::error_code>(this,0x20,"Internal library error: Processor",(error_code *)local_c8)
      ;
    }
    return;
  }
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
            ((this->m_elog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0x20,"Internal library error: missing processor",in_RCX);
  return;
}

Assistant:

void connection<config>::send_http_request() {
    m_alog->write(log::alevel::devel,"connection send_http_request");

    // TODO: origin header?

    // Have the protocol processor fill in the appropriate fields based on the
    // selected client version
    if (m_processor) {
        lib::error_code ec;
        ec = m_processor->client_handshake_request(m_request,m_uri,
            m_requested_subprotocols);

        if (ec) {
            log_err(log::elevel::fatal,"Internal library error: Processor",ec);
            return;
        }
    } else {
        m_elog->write(log::elevel::fatal,"Internal library error: missing processor");
        return;
    }

    // Unless the user has overridden the user agent, send generic WS++ UA.
    if (m_request.get_header("User-Agent").empty()) {
        if (!m_user_agent.empty()) {
            m_request.replace_header("User-Agent",m_user_agent);
        } else {
            m_request.remove_header("User-Agent");
        }
    }

    m_handshake_buffer = m_request.raw();

    if (m_alog->static_test(log::alevel::devel)) {
        m_alog->write(log::alevel::devel,"Raw Handshake request:\n"+m_handshake_buffer);
    }

    if (m_open_handshake_timeout_dur > 0) {
        m_handshake_timer = transport_con_type::set_timer(
            m_open_handshake_timeout_dur,
            lib::bind(
                &type::handle_open_handshake_timeout,
                type::get_shared(),
                lib::placeholders::_1
            )
        );
    }

    transport_con_type::async_write(
        m_handshake_buffer.data(),
        m_handshake_buffer.size(),
        lib::bind(
            &type::handle_send_http_request,
            type::get_shared(),
            lib::placeholders::_1
        )
    );
}